

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O1

ref<immutable::transient_rrb<int,_false,_6>_> __thiscall
immutable::rrb_to_transient<int,false,6>(immutable *this,ref<immutable::rrb<int,_false,_6>_> *in)

{
  int *piVar1;
  uint uVar2;
  uint32_t uVar3;
  rrb<int,_false,_6> *prVar4;
  leaf_node<int,_false> *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  tree_node<int,_false> *ptVar8;
  guid_type gVar9;
  int iVar10;
  undefined8 *puVar11;
  pthread_t pVar12;
  leaf_node<int,_false> *__s;
  char *__function;
  ulong uVar13;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_30;
  
  prVar4 = in->ptr;
  puVar11 = (undefined8 *)malloc(0x30);
  uVar6 = *(undefined8 *)prVar4;
  uVar7 = *(undefined8 *)&prVar4->tail_len;
  ptVar8 = (prVar4->root).ptr;
  puVar11[2] = (prVar4->tail).ptr;
  puVar11[3] = ptVar8;
  *puVar11 = uVar6;
  puVar11[1] = uVar7;
  puVar11[4] = *(undefined8 *)&prVar4->_ref_count;
  if (puVar11[3] != 0) {
    piVar1 = (int *)(puVar11[3] + 8);
    *piVar1 = *piVar1 + 1;
  }
  if (puVar11[2] != 0) {
    piVar1 = (int *)(puVar11[2] + 8);
    *piVar1 = *piVar1 + 1;
  }
  pVar12 = pthread_self();
  puVar11[5] = pVar12;
  *(undefined8 **)this = puVar11;
  if (puVar11 != (undefined8 *)0x0) {
    *(undefined4 *)(puVar11 + 4) = 1;
  }
  gVar9 = rrb_details::g_guid;
  LOCK();
  UNLOCK();
  if (puVar11 == (undefined8 *)0x0) {
    __function = 
    "T *immutable::ref<immutable::transient_rrb<int, false, 6>>::operator->() const [T = immutable::transient_rrb<int, false, 6>]"
    ;
    rrb_details::g_guid = rrb_details::g_guid + 1;
  }
  else {
    iVar10 = rrb_details::g_guid + 1;
    *(guid_type *)((long)puVar11 + 0x24) = rrb_details::g_guid;
    rrb_details::g_guid = iVar10;
    if (prVar4 != (rrb<int,_false,_6> *)0x0) {
      plVar5 = (prVar4->tail).ptr;
      __s = (leaf_node<int,_false> *)malloc(0x118);
      memset(__s,0,0x118);
      __s->len = plVar5->len;
      __s->type = LEAF_NODE;
      __s->child = (int *)(__s + 1);
      uVar2 = plVar5->len;
      if ((ulong)uVar2 != 0) {
        piVar1 = plVar5->child;
        uVar13 = 0;
        do {
          (&__s[1].type)[uVar13] = piVar1[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      __s->guid = gVar9;
      __s->_ref_count = 1;
      local_30.ptr = __s;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar11 + 2),&local_30);
      if ((local_30.ptr != (leaf_node<int,_false> *)0x0) &&
         (uVar3 = (local_30.ptr)->_ref_count, (local_30.ptr)->_ref_count = uVar3 - 1, uVar3 == 1)) {
        free(local_30.ptr);
      }
      return (ref<immutable::transient_rrb<int,_false,_6>_>)(transient_rrb<int,_false,_6> *)this;
    }
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> rrb_to_transient(const ref<rrb<T, atomic_ref_counting, N>>& in)
    {
    using namespace rrb_details;
    ref<transient_rrb<T, atomic_ref_counting, N>> trrb = transient_rrb_head_create(in.ptr);
    trrb->guid = rrb_guid_create();
    trrb->tail = transient_leaf_node_clone<T, atomic_ref_counting, N>(in->tail.ptr, trrb->guid);
    return trrb;
    }